

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,longlong value)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char local_48 [40];
  
  uVar5 = -value;
  if (0 < value) {
    uVar5 = value;
  }
  lVar2 = 0x3f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar6 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar6 = (uVar6 - (uVar5 < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)[uVar6])) +
          1;
  uVar7 = (ulong)uVar6;
  if (value < 0) {
    local_48[0] = '-';
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&this->out_,local_48);
  }
  pcVar3 = local_48 + uVar7;
  uVar8 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar8 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar8 + (int)uVar5 * -100) * 2)
      ;
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar8;
      uVar8 = uVar5;
    } while (bVar1);
  }
  local_58._M_stream = (this->out_)._M_stream;
  local_58._M_string = (this->out_)._M_string;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar2 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
    lVar2 = -2;
  }
  pcVar3[lVar2] = bVar4;
  if (0 < (int)uVar6) {
    pcVar3 = local_48;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,pcVar3);
      pcVar3 = pcVar3 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  (this->out_)._M_stream = local_58._M_stream;
  (this->out_)._M_string = local_58._M_string;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }